

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxColorCast::FxColorCast(FxColorCast *this,FxExpression *x)

{
  FxExpression *x_local;
  FxColorCast *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ColorCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxColorCast_00a09dc8;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeColor;
  return;
}

Assistant:

FxColorCast::FxColorCast(FxExpression *x)
	: FxExpression(EFX_ColorCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeColor;
}